

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::ColorQuant::addImage(ColorQuant *this,Image *img)

{
  uint8 *p;
  byte *pbStack_38;
  int x;
  uint8 *line;
  byte *pbStack_28;
  int y;
  uint8 *pixels;
  uint8 rgba [4];
  RGBA col;
  Image *img_local;
  ColorQuant *this_local;
  
  pbStack_28 = img->pixels;
  _rgba = img;
  for (line._4_4_ = 0; line._4_4_ < _rgba->height; line._4_4_ = line._4_4_ + 1) {
    pbStack_38 = pbStack_28;
    for (p._4_4_ = 0; p._4_4_ < _rgba->width; p._4_4_ = p._4_4_ + 1) {
      switch(_rgba->depth) {
      case 4:
      case 8:
        conv_RGBA8888_from_RGBA8888((uint8 *)&pixels,_rgba->palette + (int)((uint)*pbStack_38 << 2))
        ;
        break;
      default:
        break;
      case 0x10:
        conv_RGBA8888_from_ARGB1555((uint8 *)&pixels,pbStack_38);
        break;
      case 0x18:
        conv_RGBA8888_from_RGB888((uint8 *)&pixels,pbStack_38);
        break;
      case 0x20:
        conv_RGBA8888_from_RGBA8888((uint8 *)&pixels,pbStack_38);
      }
      pixels._4_4_ = (RGBA)CONCAT13(pixels._3_1_,
                                    CONCAT12(pixels._2_1_,CONCAT11(pixels._1_1_,pixels._0_1_)));
      addColor(this,pixels._4_4_);
      pbStack_38 = pbStack_38 + _rgba->bpp;
    }
    pbStack_28 = pbStack_28 + _rgba->stride;
  }
  return;
}

Assistant:

void
ColorQuant::addImage(Image *img)
{
	RGBA col;
	uint8 rgba[4];
	uint8 *pixels = img->pixels;
	for(int y = 0; y < img->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < img->width; x++){
			uint8 *p = line;
			switch(img->depth){
			case 4: case 8:
				conv_RGBA8888_from_RGBA8888(rgba, &img->palette[p[0]*4]);
				break;
			case 32:
				conv_RGBA8888_from_RGBA8888(rgba, p);
				break;
			case 24:
				conv_RGBA8888_from_RGB888(rgba, p);
				break;
			case 16:
				conv_RGBA8888_from_ARGB1555(rgba, p);
				break;
			default: assert(0 && "invalid depth");
			}
			col.red = rgba[0];
			col.green = rgba[1];
			col.blue = rgba[2];
			col.alpha = rgba[3];
			this->addColor(col);
			line += img->bpp;
		}
		pixels += img->stride;
	}
}